

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fitscore.c
# Opt level: O0

int fits_copy_pixlist2image
              (fitsfile *infptr,fitsfile *outfptr,int firstkey,int naxis,int *colnum,int *status)

{
  int in_EDX;
  int *in_R9;
  char *patterns [99] [2];
  int lret;
  int mret;
  int nret;
  int jret;
  int iret;
  int npat;
  int pat_num;
  char outrec [81];
  char rec [81];
  int nmore;
  int nkeys;
  int nrec;
  int *in_stack_fffffffffffff858;
  int *in_stack_fffffffffffff860;
  fitsfile *in_stack_fffffffffffff868;
  int *in_stack_fffffffffffff898;
  int in_stack_fffffffffffff8a0;
  int in_stack_fffffffffffff8a4;
  char *(*in_stack_fffffffffffff8a8) [2];
  char *in_stack_fffffffffffff8b0;
  char *in_stack_fffffffffffff8b8;
  int *in_stack_fffffffffffff8c8;
  int *in_stack_fffffffffffff8d0;
  fitsfile *in_stack_fffffffffffff8d8;
  int *in_stack_fffffffffffff8e0;
  int *in_stack_fffffffffffff8e8;
  int *in_stack_fffffffffffff8f0;
  int *in_stack_fffffffffffff8f8;
  int *in_stack_fffffffffffff900;
  fitsfile local_128;
  char local_118;
  undefined1 local_110;
  undefined1 local_b0;
  int local_58;
  int local_54;
  int *local_50;
  int local_3c;
  int local_24;
  
  local_128.Fptr._4_4_ = 0;
  local_50 = in_R9;
  local_3c = in_EDX;
  memcpy(&stack0xfffffffffffff898,&PTR_anon_var_dwarf_15bd7_002922f0,0x630);
  if (*local_50 < 1) {
    local_128.Fptr._0_4_ = 99;
    ffghsp(in_stack_fffffffffffff868,in_stack_fffffffffffff860,in_stack_fffffffffffff858,
           (int *)0x165f70);
    for (local_54 = local_3c; local_54 <= local_58; local_54 = local_54 + 1) {
      local_118 = '\0';
      ffgrec(in_stack_fffffffffffff868,(int)((ulong)in_stack_fffffffffffff860 >> 0x20),
             (char *)in_stack_fffffffffffff858,(int *)0x165fbe);
      in_stack_fffffffffffff858 = (int *)((long)&local_128.Fptr + 4);
      in_stack_fffffffffffff860 = (int *)&local_128.field_0x4;
      in_stack_fffffffffffff868 = &local_128;
      fits_translate_pixkeyword
                (in_stack_fffffffffffff8b8,in_stack_fffffffffffff8b0,in_stack_fffffffffffff8a8,
                 in_stack_fffffffffffff8a4,in_stack_fffffffffffff8a0,in_stack_fffffffffffff898,
                 in_stack_fffffffffffff8d0,&in_stack_fffffffffffff8d8->HDUposition,
                 in_stack_fffffffffffff8e0,in_stack_fffffffffffff8e8,in_stack_fffffffffffff8f0,
                 in_stack_fffffffffffff8f8,in_stack_fffffffffffff900);
      if (local_118 != '\0') {
        ffprec(in_stack_fffffffffffff8d8,(char *)in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8
              );
      }
      local_b0 = 0;
      local_110 = 0;
    }
    local_24 = *local_50;
  }
  else {
    local_24 = *local_50;
  }
  return local_24;
}

Assistant:

int fits_copy_pixlist2image(
	   fitsfile *infptr,   /* I - pointer to input HDU */
	   fitsfile *outfptr,  /* I - pointer to output HDU */
	   int firstkey,       /* I - first HDU record number to start with */
           int naxis,          /* I - number of axes in the image */
           int *colnum,       /* I - numbers of the columns to be binned  */
           int *status)        /* IO - error status */
/*
     Copy relevant keywords from the pixel list table header into a newly
     created primary array header.  Convert names of keywords where
     appropriate.  See fits_translate_pixkeyword() for the definitions.

     Translation begins at header record number 'firstkey', and
     continues to the end of the header.
*/
{
    int nrec, nkeys, nmore;
    char rec[FLEN_CARD], outrec[FLEN_CARD];
    int pat_num = 0, npat;
    int iret, jret, nret, mret, lret;
    char *patterns[][2] = {

			   {"TCTYPn",  "CTYPEn"    },
			   {"TCTYna",  "CTYPEna"   },
			   {"TCUNIn",  "CUNITn"    },
			   {"TCUNna",  "CUNITna"   },
			   {"TCRVLn",  "CRVALn"    },
			   {"TCRVna",  "CRVALna"   },
			   {"TCDLTn",  "CDELTn"    },
			   {"TCDEna",  "CDELTna"   },
			   {"TCRPXn",  "CRPIXn"    },
			   {"TCRPna",  "CRPIXna"   },
			   {"TCROTn",  "CROTAn"    },
			   {"TPn_ma",  "PCn_ma"    },
			   {"TPCn_m",  "PCn_ma"    },
			   {"TCn_ma",  "CDn_ma"    },
			   {"TCDn_m",  "CDn_ma"    },
			   {"TVn_la",  "PVn_la"    },
			   {"TPVn_l",  "PVn_la"    },
			   {"TSn_la",  "PSn_la"    },
			   {"TPSn_l",  "PSn_la"    },
			   {"TWCSna",  "WCSNAMEa"  },
			   {"TCNAna",  "CNAMEna"   },
			   {"TCRDna",  "CRDERna"   },
			   {"TCSYna",  "CSYERna"   },
			   {"LONPna",  "LONPOLEa"  },
			   {"LATPna",  "LATPOLEa"  },
			   {"EQUIna",  "EQUINOXa"  },
			   {"MJDOBn",  "MJD-OBS"   },
			   {"MJDAn",   "MJD-AVG"   },
			   {"DAVGn",   "DATE-AVG"  },
			   {"RADEna",  "RADESYSa"  },
			   {"RFRQna",  "RESTFRQa"  },
			   {"RWAVna",  "RESTWAVa"  },
			   {"SPECna",  "SPECSYSa"  },
			   {"SOBSna",  "SSYSOBSa"  },
			   {"SSRCna",  "SSYSSRCa"  },

                           /* preserve common keywords */
			   {"LONPOLEa",   "+"       },
			   {"LATPOLEa",   "+"       },
			   {"EQUINOXa",   "+"       },
			   {"EPOCH",      "+"       },
			   {"MJD-????",   "+"       },
			   {"DATE????",   "+"       },
			   {"TIME????",   "+"       },
			   {"RADESYSa",   "+"       },
			   {"RADECSYS",   "+"       },
			   {"TELESCOP",   "+"       },
			   {"INSTRUME",   "+"       },
			   {"OBSERVER",   "+"       },
			   {"OBJECT",     "+"       },

                           /* Delete general table column keywords */
			   {"XTENSION", "-"       },
			   {"BITPIX",   "-"       },
			   {"NAXIS",    "-"       },
			   {"NAXISi",   "-"       },
			   {"PCOUNT",   "-"       },
			   {"GCOUNT",   "-"       },
			   {"TFIELDS",  "-"       },

			   {"TDIM#",   "-"       },
			   {"THEAP",   "-"       },
			   {"EXTNAME", "-"       }, 
			   {"EXTVER",  "-"       },
			   {"EXTLEVEL","-"       },
			   {"CHECKSUM","-"       },
			   {"DATASUM", "-"       },
			   {"NAXLEN",  "-"       },
			   {"AXLEN#",  "-"       },
			   {"CPREF",  "-"       },
			   
                           /* Delete table keywords related to other columns */
			   {"T????#a", "-"       }, 
 			   {"TC??#a",  "-"       },
 			   {"T??#_#",  "-"       },
 			   {"TWCS#a",  "-"       },

			   {"LONP#a",  "-"       },
			   {"LATP#a",  "-"       },
			   {"EQUI#a",  "-"       },
			   {"MJDOB#",  "-"       },
			   {"MJDA#",   "-"       },
			   {"RADE#a",  "-"       },
			   {"DAVG#",   "-"       },

			   {"iCTYP#",  "-"       },
			   {"iCTY#a",  "-"       },
			   {"iCUNI#",  "-"       },
			   {"iCUN#a",  "-"       },
			   {"iCRVL#",  "-"       },
			   {"iCDLT#",  "-"       },
			   {"iCRPX#",  "-"       },
			   {"iCTY#a",  "-"       },
			   {"iCUN#a",  "-"       },
			   {"iCRV#a",  "-"       },
			   {"iCDE#a",  "-"       },
			   {"iCRP#a",  "-"       },
			   {"ijPC#a",  "-"       },
			   {"ijCD#a",  "-"       },
			   {"iV#_#a",  "-"       },
			   {"iS#_#a",  "-"       },
			   {"iCRD#a",  "-"       },
			   {"iCSY#a",  "-"       },
			   {"iCROT#",  "-"       },
			   {"WCAX#a",  "-"       },
			   {"WCSN#a",  "-"       },
			   {"iCNA#a",  "-"       },

			   {"*",       "+"       }}; /* copy all other keywords */

    if (*status > 0)
        return(*status);

    npat = sizeof(patterns)/sizeof(patterns[0][0])/2;

    ffghsp(infptr, &nkeys, &nmore, status);  /* get number of keywords */

    for (nrec = firstkey; nrec <= nkeys; nrec++) {
      outrec[0] = '\0';

      ffgrec(infptr, nrec, rec, status);

      fits_translate_pixkeyword(rec, outrec, patterns, npat, 
			     naxis, colnum, 
			     &pat_num, &iret, &jret, &nret, &mret, &lret, status);

      if (outrec[0]) {
	ffprec(outfptr, outrec, status); /* copy the keyword */
      } 

      rec[8] = 0; outrec[8] = 0;
    }	

    return(*status);
}